

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockBuilderVisitor.cpp
# Opt level: O0

void __thiscall
IRT::BlockBuilderVisitor::Visit
          (BlockBuilderVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  Statement *root;
  ConditionalBlock *this_00;
  mapped_type *ppBVar1;
  string local_d0;
  string local_b0;
  undefined1 local_89;
  Label local_88;
  Label local_68;
  Label local_38;
  JumpConditionalStatement *local_18;
  JumpConditionalStatement *jump_conditional_statement_local;
  BlockBuilderVisitor *this_local;
  
  local_18 = jump_conditional_statement;
  jump_conditional_statement_local = (JumpConditionalStatement *)this;
  this_00 = (ConditionalBlock *)operator_new(0x80);
  local_89 = 1;
  Label::Label(&local_38,&this->current_label_);
  root = this->current_root_;
  Label::Label(&local_68,&local_18->label_true_);
  Label::Label(&local_88,&local_18->label_false_);
  ConditionalBlock::ConditionalBlock(this_00,&local_38,root,&local_68,&local_88);
  local_89 = 0;
  Label::ToString_abi_cxx11_(&local_b0,&this->current_label_);
  ppBVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*>_>_>
            ::operator[](&this->blocks_,&local_b0);
  *ppBVar1 = (mapped_type)this_00;
  std::__cxx11::string::~string((string *)&local_b0);
  Label::~Label(&local_88);
  Label::~Label(&local_68);
  Label::~Label(&local_38);
  if (this->root_block_ == (Block *)0x0) {
    Label::ToString_abi_cxx11_(&local_d0,&this->current_label_);
    ppBVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*>_>_>
              ::operator[](&this->blocks_,&local_d0);
    this->root_block_ = *ppBVar1;
    std::__cxx11::string::~string((string *)&local_d0);
  }
  (*(local_18->left_operand_->super_BaseElement)._vptr_BaseElement[2])(local_18->left_operand_,this)
  ;
  (*(local_18->right_operand_->super_BaseElement)._vptr_BaseElement[2])
            (local_18->right_operand_,this);
  return;
}

Assistant:

void BlockBuilderVisitor::Visit(
    JumpConditionalStatement *jump_conditional_statement) {
  blocks_[current_label_.ToString()] = new ConditionalBlock(
      current_label_, current_root_, jump_conditional_statement->label_true_,
      jump_conditional_statement->label_false_);

  if (root_block_ == nullptr) {
    root_block_ = blocks_[current_label_.ToString()];
  }

  jump_conditional_statement->left_operand_->Accept(this);
  jump_conditional_statement->right_operand_->Accept(this);
}